

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ags.cpp
# Opt level: O2

bool dxil_spv::validate_wmma_io_registers
               (Impl *impl,uint32_t base_argument,
               AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,uint32_t phase,
               bool input_validation)

{
  ulong uVar1;
  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  bool bVar2;
  bool bVar3;
  Id IVar4;
  Id IVar5;
  Value *pVVar6;
  Value *value;
  iterator iVar7;
  iterator iVar8;
  uint32_t i;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong local_68;
  Value *value1;
  Value *value0;
  _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_38;
  
  if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation) {
    uVar9 = 0;
    while (bVar2 = uVar9 == 8, !bVar2) {
      uVar11 = base_argument + (uint)uVar9;
      uVar10 = (impl->ags).instructions[uVar11].immediate;
      if (0xff < uVar10) {
        return bVar2;
      }
      if ((impl->ags).instructions[uVar11].phase != phase) {
        return bVar2;
      }
      if ((uVar10 & 0xf) != ((uint)uVar9 & 3)) {
        return bVar2;
      }
      uVar1 = uVar9 >> 2;
      uVar9 = uVar9 + 1;
      if (uVar10 >> 4 != ((uint)uVar1 & 0x3fffffff)) {
        return bVar2;
      }
    }
  }
  else {
    pVVar6 = LLVMBC::Instruction::getOperand
                       (&(impl->ags).backdoor_instructions[base_argument]->super_Instruction,5);
    uVar9 = 0;
    IVar4 = Converter::Impl::get_id_for_value(impl,pVVar6,0);
    bVar2 = true;
    while ((uVar9 < 4 && (bVar2 != false))) {
      uVar10 = base_argument + (int)uVar9;
      pVVar6 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar10]->super_Instruction,5);
      value = LLVMBC::Instruction::getOperand
                        (&(impl->ags).backdoor_instructions[uVar10]->super_Instruction,6);
      bVar2 = LLVMBC::isa<LLVMBC::PHINode>(pVVar6);
      if ((bVar2) || (bVar2 = LLVMBC::isa<LLVMBC::LoadInst>(pVVar6), bVar2)) {
        bVar3 = LLVMBC::isa<LLVMBC::PHINode>(value);
        bVar2 = true;
        if (!bVar3) {
          bVar2 = LLVMBC::isa<LLVMBC::LoadInst>(value);
        }
      }
      else {
        bVar2 = false;
      }
      uVar9 = uVar9 + 1;
    }
    local_38 = &(impl->ags).coopmat_component_mapping._M_h;
    local_68 = 0;
    for (uVar9 = 0; uVar9 != 4; uVar9 = uVar9 + 1) {
      uVar10 = base_argument + (uint)uVar9;
      value0 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar10]->super_Instruction,5);
      value1 = LLVMBC::Instruction::getOperand
                         (&(impl->ags).backdoor_instructions[uVar10]->super_Instruction,6);
      this = local_38;
      iVar7 = std::
              _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(local_38,&value0);
      iVar8 = std::
              _Hashtable<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(this,&value1);
      if ((((impl->ags).instructions[uVar10].phase != phase) ||
          (iVar7.
           super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
           ._M_cur == (__node_type *)0x0)) ||
         (local_68 !=
          *(uint *)((long)iVar7.
                          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                          ._M_cur + 0x14))) {
        return false;
      }
      if (bVar2 == false) {
        IVar5 = Converter::Impl::get_id_for_value(impl,value0,0);
        if (IVar5 != IVar4) {
          return false;
        }
        if (iVar8.
            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
            ._M_cur == (__node_type *)0x0) {
          return false;
        }
        if (local_68 + 1 !=
            (ulong)*(uint *)((long)iVar8.
                                   super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                   ._M_cur + 0x14)) {
          return false;
        }
        IVar5 = Converter::Impl::get_id_for_value(impl,value1,0);
        if (IVar5 != IVar4) {
          return false;
        }
      }
      else {
        if (iVar8.
            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
            ._M_cur == (__node_type *)0x0) {
          return false;
        }
        if (local_68 + 1 !=
            (ulong)*(uint *)((long)iVar8.
                                   super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AGSCoopMatMapping>,_false>
                                   ._M_cur + 0x14)) {
          return false;
        }
      }
      uVar10 = (impl->ags).instructions[uVar10].immediate;
      if (0x7ff < uVar10) {
        return false;
      }
      if ((uVar10 >> 8 & 0xff) != reg_type) {
        return false;
      }
      if ((uVar10 & 0xf) != ((uint)uVar9 & 1)) {
        return false;
      }
      if ((uVar10 >> 4 & 0xf) != ((uint)(uVar9 >> 1) & 0x7fffffff)) {
        return false;
      }
      local_68 = local_68 + 2;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool validate_wmma_io_registers(Converter::Impl &impl, uint32_t base_argument,
                                       AmdExtD3DShaderIntrinsicsWaveMatrixRegType reg_type,
                                       uint32_t phase, bool input_validation)
{
	if (reg_type == AmdExtD3DShaderIntrinsicsWaveMatrixRegType_RetVal_Reg && !input_validation)
	{
		// 8 outputs
		for (uint32_t i = 0; i < 8; i++)
		{
			uint32_t inst_index = base_argument + i;
			uint32_t imm = impl.ags.instructions[inst_index].immediate;
			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 4 || reg != i / 4)
				return false;
		}
	}
	else
	{
		spv::Id coopmat_id = impl.get_id_for_value(impl.ags.backdoor_instructions[base_argument]->getOperand(5));

		// If the matrix is PHI or loaded from alloca, we only check component mapping.
		bool all_phi_or_load = true;
		for (uint32_t i = 0; i < 4 && all_phi_or_load; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			all_phi_or_load =
				(llvm::isa<llvm::PHINode>(value0) || llvm::isa<llvm::LoadInst>(value0)) &&
				(llvm::isa<llvm::PHINode>(value1) || llvm::isa<llvm::LoadInst>(value1));
		}

		// 4x2 inputs.
		for (uint32_t i = 0; i < 4; i++)
		{
			uint32_t inst_index = base_argument + i;
			const auto *value0 = impl.ags.backdoor_instructions[inst_index]->getOperand(5);
			const auto *value1 = impl.ags.backdoor_instructions[inst_index]->getOperand(6);
			auto itr0 = impl.ags.coopmat_component_mapping.find(value0);
			auto itr1 = impl.ags.coopmat_component_mapping.find(value1);

			if (impl.ags.instructions[inst_index].phase != phase)
				return false;

			// Don't accept any weird shuffle.
			if (itr0 == impl.ags.coopmat_component_mapping.end() || itr0->second.component != 2 * i + 0 ||
			    (!all_phi_or_load && impl.get_id_for_value(value0) != coopmat_id))
			{
				return false;
			}

			if (itr1 == impl.ags.coopmat_component_mapping.end() || itr1->second.component != 2 * i + 1 ||
			    (!all_phi_or_load && impl.get_id_for_value(value1) != coopmat_id))
			{
				return false;
			}

			uint32_t imm = impl.ags.instructions[inst_index].immediate;

			uint32_t channel = get_matrix_io_channel(imm);
			uint32_t reg = get_matrix_io_register(imm);
			uint32_t type = get_matrix_io_type(imm);

			// Check for unexpected cases.
			if ((imm >> AmdExtD3DShaderIntrinsicsWaveMatrixModifier_MatrixTileShift) != 0)
				return false;
			if (type != reg_type)
				return false;
			if (channel != i % 2 || reg != i / 2)
				return false;
		}
	}

	return true;
}